

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_file.c
# Opt level: O0

_Bool internal_file_exists(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_value_t value;
  gravity_value_t value_00;
  _Bool _Var1;
  gravity_fiber_t *fiber;
  _Bool exists;
  char *path;
  char local_1028 [8];
  char _buffer [4096];
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  _buffer._4088_4_ = rindex;
  _buffer._4094_2_ = nargs;
  if ((nargs == 2) || (args[1].isa == gravity_class_string)) {
    _Var1 = file_exists((char *)(args[1].field_1.p)->objclass);
    value.field_1.n._0_1_ = _Var1;
    value.isa = gravity_class_bool;
    value.field_1.n._1_7_ = 0;
    gravity_vm_setslot(vm,value,_buffer._4088_4_);
    vm_local._7_1_ = true;
  }
  else {
    snprintf(local_1028,0x1000,"A path parameter of type String is required.");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1028);
    value_00.field_1.n = 0;
    value_00.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_00,_buffer._4088_4_);
    vm_local._7_1_ = false;
  }
  return vm_local._7_1_;
}

Assistant:

static bool internal_file_exists (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    // 1 parameter of type string is required
    if (nargs != 2 && !VALUE_ISA_STRING(args[1])) {
        RETURN_ERROR("A path parameter of type String is required.");
    }
    
    char *path = VALUE_AS_STRING(args[1])->s;
    bool exists = file_exists((const char *)path);
    RETURN_VALUE(VALUE_FROM_BOOL(exists), rindex);
}